

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean check_capacity(char *str)

{
  int iVar1;
  char *str_local;
  
  iVar1 = near_capacity();
  if (iVar1 < 4) {
    str_local._7_1_ = '\0';
  }
  else {
    if (str == (char *)0x0) {
      pline("You can\'t do that while carrying so much stuff.");
    }
    else {
      pline(str);
    }
    str_local._7_1_ = '\x01';
  }
  return str_local._7_1_;
}

Assistant:

boolean check_capacity(const char *str)
{
    if (near_capacity() >= EXT_ENCUMBER) {
	if (str)
	    pline(str);
	else
	    pline("You can't do that while carrying so much stuff.");
	return 1;
    }
    return 0;
}